

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O2

void PrintHierarchy(aiNode *node,string *indent,bool verbose,bool last,bool first)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  int iVar4;
  undefined7 in_register_00000081;
  size_t i;
  ulong uVar5;
  size_t i_1;
  string nextIndent;
  string branchchar;
  string local_c0;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_90;
  int local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  float local_70;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  iVar4 = (int)CONCAT71(in_register_00000081,first);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  if (iVar4 == 0) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  else {
    std::__cxx11::string::assign((char *)&local_50);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  std::operator<<(poVar3,(node->mName).data);
  if (node->mNumMeshes != 0) {
    std::operator<<((ostream *)&std::cout," (mesh ");
    local_7c = (undefined4)CONCAT71(in_register_00000009,last);
    bVar2 = false;
    local_80 = iVar4;
    local_58 = indent;
    for (uVar5 = 0; uVar5 < node->mNumMeshes; uVar5 = uVar5 + 1) {
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      bVar2 = true;
    }
    std::operator<<((ostream *)&std::cout,")");
    last = SUB41(local_7c,0);
    first = SUB41(local_80,0);
    indent = local_58;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (!verbose) goto LAB_0030bf61;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  if (last == false) {
    std::__cxx11::string::append((char *)&local_c0);
  }
  else {
    std::__cxx11::string::append((char *)&local_c0);
  }
  if (node->mNumChildren == 0) {
    std::__cxx11::string::append((char *)&local_c0);
  }
  else {
    std::__cxx11::string::append((char *)&local_c0);
  }
  local_78 = (undefined1  [8])0x0;
  local_70 = 0.0;
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_90.z = 0.0;
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_a0.z = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&node->mTransformation,(aiVector3t<float> *)local_78,&local_90,&local_a0);
  if (((float)local_78._0_4_ != 1.0) || (NAN((float)local_78._0_4_))) {
LAB_0030be49:
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
    std::operator<<(poVar3,(string *)&local_c0);
    printf("  S:[%f %f %f]\n",(double)(float)local_78._0_4_,(double)(float)local_78._4_4_,
           (double)local_70);
  }
  else if (((float)local_78._4_4_ != 1.0) ||
          (((NAN((float)local_78._4_4_) || (local_70 != 1.0)) || (NAN(local_70)))))
  goto LAB_0030be49;
  if ((local_90.x != 0.0) || (NAN(local_90.x))) {
LAB_0030beb2:
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
    std::operator<<(poVar3,(string *)&local_c0);
    printf("  R:[%f %f %f]\n",(double)local_90.x,(double)local_90.y,(double)local_90.z);
  }
  else if (((local_90.y != 0.0) || ((NAN(local_90.y) || (local_90.z != 0.0)))) || (NAN(local_90.z)))
  goto LAB_0030beb2;
  if ((local_a0.x != 0.0) || (NAN(local_a0.x))) {
LAB_0030bf1b:
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
    std::operator<<(poVar3,(string *)&local_c0);
    printf("  T:[%f %f %f]\n",(double)local_a0.x,(double)local_a0.y,(double)local_a0.z);
  }
  else if ((local_a0.y != 0.0) || (((NAN(local_a0.y) || (local_a0.z != 0.0)) || (NAN(local_a0.z)))))
  goto LAB_0030bf1b;
  std::__cxx11::string::~string((string *)&local_c0);
LAB_0030bf61:
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  if (first == false) {
    if (last == false) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     indent,TREE_CONTINUE);
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     indent,"  ");
    }
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
  for (uVar5 = 0; uVar5 < node->mNumChildren; uVar5 = uVar5 + 1) {
    PrintHierarchy(node->mChildren[uVar5],&local_c0,verbose,uVar5 == node->mNumChildren - 1,false);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void PrintHierarchy(
	const aiNode* node,
	const std::string &indent,
	bool verbose,
	bool last = false,
	bool first = true
){
	// tree visualization
	std::string branchchar;
	if (first) { branchchar = ""; }
	else if (last) { branchchar = TREE_STOP; } // "'-"
	else { branchchar = TREE_BRANCH; } // "|-"

	// print the indent and the branch character and the name
	std::cout << indent << branchchar << node->mName.C_Str();

	// if there are meshes attached, indicate this
	if (node->mNumMeshes) {
		std::cout << " (mesh ";
		bool sep = false;
		for (size_t i=0; i < node->mNumMeshes; ++i) {
			unsigned int mesh_index = node->mMeshes[i];
			if (sep) { std::cout << ", "; }
			std::cout << mesh_index;
			sep = true;
		}
		std::cout << ")";
	}

	// finish the line
	std::cout << std::endl;

	// in verbose mode, print the transform data as well
	if (verbose) {
		// indent to use
		std::string indentadd;
		if (last) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // "| "..
		if (node->mNumChildren == 0) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // .."| "
		aiVector3D s, r, t;
		node->mTransformation.Decompose(s, r, t);
		if (s.x != 1.0 || s.y != 1.0 || s.z != 1.0) {
			std::cout << indent << indentadd;
			printf("  S:[%f %f %f]\n", s.x, s.y, s.z);
		}
		if (r.x || r.y || r.z) {
			std::cout << indent << indentadd;
			printf("  R:[%f %f %f]\n", r.x, r.y, r.z);
		}
		if (t.x || t.y || t.z) {
			std::cout << indent << indentadd;
			printf("  T:[%f %f %f]\n", t.x, t.y, t.z);
		}
	}

	// and recurse
	std::string nextIndent;
	if (first) { nextIndent = indent; }
	else if (last) { nextIndent = indent + "  "; }
	else { nextIndent = indent + TREE_CONTINUE; } // "| "
	for (size_t i = 0; i < node->mNumChildren; ++i) {
		bool lastone = (i == node->mNumChildren - 1);
		PrintHierarchy(
			node->mChildren[i],
			nextIndent,
			verbose,
			lastone,
			false
		);
	}
}